

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

ssize_t __thiscall Kvm::read(Kvm *this,int __fd,void *__buf,size_t __nbytes)

{
  Kgc *this_00;
  pointer *ppppVVar1;
  Value *pVVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long *plVar7;
  istream *piVar8;
  Value *pVVar9;
  ostream *poVar10;
  _func_int **pp_Var11;
  Value *pVVar12;
  runtime_error *prVar13;
  void *__buf_00;
  undefined4 in_register_00000034;
  Kvm *in;
  char cVar14;
  Kvm *this_01;
  ulong uVar15;
  long lVar16;
  long lVar17;
  char c;
  string buffer;
  byte local_79;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  in = (Kvm *)CONCAT44(in_register_00000034,__fd);
  anon_unknown.dwarf_ec09::eatWhitespace((istream *)in);
  std::operator>>((istream *)in,(char *)&local_79);
  if ((*(byte *)((long)&(in->interned_strings)._M_h._M_buckets[-3]->_M_nxt +
                (long)&(in->interned_strings)._M_h._M_rehash_policy._M_max_load_factor) & 5) != 0) {
    return (ssize_t)(Value *)0x0;
  }
  if ((char)local_79 == 0x23) {
    this_01 = in;
    std::operator>>((istream *)in,(char *)&local_79);
    if (local_79 == 0x5c) {
      pVVar9 = readCharacter(this_01,(istream *)in);
      return (ssize_t)pVVar9;
    }
    if (local_79 != 0x66) {
      if (local_79 == 0x74) {
        return (ssize_t)this->TRUE;
      }
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,"unknown boolean literal","");
      std::runtime_error::runtime_error(prVar13,(string *)local_78);
      *(undefined ***)prVar13 = &PTR__runtime_error_00113b28;
      __cxa_throw(prVar13,&(anonymous_namespace)::KatException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    return (ssize_t)this->FALSE;
  }
  cVar14 = (char)__fd;
  if ((int)(char)local_79 - 0x30U < 10) {
    plVar7 = (long *)std::istream::putback(cVar14);
    __nbytes = *(size_t *)(*plVar7 + -0x18);
    if ((*(byte *)((long)plVar7 + __nbytes + 0x20) & 5) == 0) {
      lVar17 = 2;
      goto LAB_0010a4b7;
    }
  }
  if (local_79 == 0x2d) {
    iVar5 = std::istream::peek();
    lVar17 = -2;
    if (iVar5 - 0x30U < 10) {
LAB_0010a4b7:
      piVar8 = std::operator>>((istream *)in,(char *)&local_79);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
        lVar16 = 0;
        do {
          if (9 < (int)(char)local_79 - 0x30U) break;
          lVar16 = (ulong)((int)(char)local_79 - 0x30U) + lVar16 * 10;
          piVar8 = std::operator>>((istream *)in,(char *)&local_79);
        } while (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0);
      }
      else {
        lVar16 = 0;
      }
      iVar5 = isspace((int)(char)local_79);
      if ((iVar5 == 0) &&
         ((0x3b < local_79 || ((0x800030400000000U >> ((ulong)(uint)local_79 & 0x3f) & 1) == 0)))) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_78._0_8_ = local_78 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,"number not followed by delimiter","");
        std::runtime_error::runtime_error(prVar13,(string *)local_78);
        *(undefined ***)prVar13 = &PTR__runtime_error_00113b28;
        __cxa_throw(prVar13,&(anonymous_namespace)::KatException::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      std::istream::putback(cVar14);
      return (ssize_t)(Value *)(lVar17 * lVar16 | 1);
    }
  }
  if (local_79 == 0x22) {
    local_78._8_8_ = 0;
    local_68._M_local_buf[0] = '\0';
    local_78._0_8_ = local_78 + 0x10;
    while ((piVar8 = std::operator>>((istream *)in,(char *)&local_79),
           ((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0 && (local_79 != 0x22))
          ) {
      if (local_79 == 0x5c) {
        piVar8 = std::operator>>((istream *)in,(char *)&local_79);
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,"non-terminated string literal","");
          std::runtime_error::runtime_error(prVar13,(string *)local_50);
          *(undefined ***)prVar13 = &PTR__runtime_error_00113b28;
          __cxa_throw(prVar13,&(anonymous_namespace)::KatException::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if (local_79 == 0x6e) {
          local_79 = 10;
        }
      }
      std::__cxx11::string::_M_replace_aux((ulong)local_78,local_78._8_8_,0,'\x01');
    }
    pVVar9 = makeString(this,(string *)local_78);
    if ((undefined1 *)local_78._0_8_ == local_78 + 0x10) {
      return (ssize_t)pVVar9;
    }
    operator_delete((void *)local_78._0_8_,
                    CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    return (ssize_t)pVVar9;
  }
  bVar4 = anon_unknown.dwarf_ec09::isInitial(local_79);
  if (bVar4) {
LAB_0010a3dc:
    local_78._0_8_ = local_78 + 0x10;
    local_78._8_8_ = 0;
    local_68._M_local_buf[0] = '\0';
    pVVar9 = (Value *)local_78;
    while ((((bVar4 = anon_unknown.dwarf_ec09::isInitial(local_79), bVar3 = local_79, bVar4 ||
             ((int)(char)local_79 - 0x30U < 10)) || (local_79 == 0x2d)) || (local_79 == 0x2b))) {
      std::__cxx11::string::_M_replace_aux((ulong)pVVar9,local_78._8_8_,0,'\x01');
      std::operator>>((istream *)in,(char *)&local_79);
    }
    iVar5 = isspace((int)(char)local_79);
    uVar15 = 1;
    if (iVar5 == 0) {
      if (bVar3 < 0x3c) {
        uVar15 = 0x800030400000000 >> (bVar3 & 0x3f);
      }
      else {
        uVar15 = 0;
      }
    }
    if ((uVar15 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"symbol not followed by delimiter. ",0x22);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Found \'",7);
      local_50[0] = (undefined1 *)CONCAT71(local_50[0]._1_7_,local_79);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,(char *)local_50,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    else {
      std::istream::putback(cVar14);
      pVVar9 = makeSymbol(this,(string *)local_78);
    }
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_,
                      CONCAT71(local_68._M_allocated_capacity._1_7_,local_68._M_local_buf[0]) + 1);
    }
    if ((uVar15 & 1) == 0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"illegal read state","");
      std::runtime_error::runtime_error(prVar13,(string *)local_78);
      *(undefined ***)prVar13 = &PTR__runtime_error_00113b28;
      __cxa_throw(prVar13,&(anonymous_namespace)::KatException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
  }
  else {
    if ((local_79 == 0x2d) || (local_79 == 0x2b)) {
      uVar6 = std::istream::peek();
      iVar5 = isspace((int)(char)(byte)uVar6);
      if ((iVar5 != 0) ||
         (((byte)uVar6 < 0x3c &&
          (__nbytes = 0x800030400000000, (0x800030400000000U >> ((ulong)uVar6 & 0x3f) & 1) != 0))))
      goto LAB_0010a3dc;
    }
    if (local_79 == 0x27) {
      local_78._0_8_ = (_func_int **)0x0;
      this_00 = &this->gc_;
      local_58 = 0;
      Kgc::pushLocalStackRoot(this_00,(Value **)local_78);
      local_58 = 0xfffffffffffffff8;
      pp_Var11 = (_func_int **)read(this,__fd,__buf_00,__nbytes);
      if (pp_Var11 == (_func_int **)0x0) {
        pVVar9 = (Value *)0x0;
      }
      else {
        pVVar9 = this->NIL;
        local_78._0_8_ = pp_Var11;
        pVVar12 = Kgc::allocValue(this_00,CELL);
        pVVar12[1]._vptr_Value = pp_Var11;
        *(Value **)&pVVar12[1].type_ = pVVar9;
        pVVar2 = this->QUOTE;
        local_78._0_8_ = pVVar12;
        pVVar9 = Kgc::allocValue(this_00,CELL);
        pVVar9[1]._vptr_Value = (_func_int **)pVVar2;
        *(Value **)&pVVar9[1].type_ = pVVar12;
      }
      ppppVVar1 = &(this->gc_).localStackRoots_.
                   super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      *ppppVVar1 = *ppppVVar1 + -1;
    }
    else {
      if (local_79 != 0x28) {
        local_78._0_8_ = local_78 + 0x10;
        local_78._8_8_ = 0;
        local_68._M_local_buf[0] = '\0';
        std::__cxx11::string::append(local_78);
        std::__cxx11::string::_M_replace_aux((ulong)local_78,local_78._8_8_,0,'\x01');
        std::__cxx11::string::append(local_78);
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar13,(string *)local_78);
        *(undefined ***)prVar13 = &PTR__runtime_error_00113b28;
        __cxa_throw(prVar13,&(anonymous_namespace)::KatException::typeinfo,
                    std::runtime_error::~runtime_error);
      }
      pVVar9 = readPair(this,(istream *)in);
    }
  }
  return (ssize_t)pVVar9;
}

Assistant:

const Value* Kvm::read(std::istream &in)
{
    eatWhitespace(in);

    int sign{1};
    long num{0};
    char c;
    in >> c;

    if (!in)
    {
        return nullptr;
    }
    if (c == '#') /* read a boolean */
    {
        in >> c;
        if (c == 't')
            return TRUE;
        else if (c == 'f')
            return FALSE;
        else if (c == '\\')
            return readCharacter(in);
        else
        {
            throw KatException("unknown boolean literal");
        }
    } else if ((isdigit(c) && in.putback(c)) ||
               (c == '-' && isdigit(in.peek()) && (sign = -1)))
    {
        /* read a fixnum */
        while (in >> c && isdigit(c))
        {
            num = num * 10 + (c - '0');
        }
        num *= sign;
        if (isDelimiter(c))
        {
            in.putback(c);
            return makeFixnum(num);
        } else
        {
            throw KatException("number not followed by delimiter");
        }
    } else if (c == '"')
    {
        string buffer;
        while (in >> c && c != '"')
        {
            if (c == '\\')
            {
                if (in >> c)
                {
                    if (c == 'n') c = '\n';
                } else
                {
                    throw KatException("non-terminated string literal");
                }
            }
            buffer.append(1, c);
        }
        return makeString(buffer);

    } else if (isInitial(c) || ((c == '+' || c == '-') && isDelimiter(in.peek()))) // FIXME: peek returns int
    {
        string symbol;
        while (isInitial(c) || isdigit(c) || c == '+' || c == '-')
        {
            symbol.append(1, c);
            in >> c;
        }
        if (isDelimiter(c))
        {
            in.putback(c);
            return makeSymbol(symbol);
        } else
        {
            cerr << "symbol not followed by delimiter. " <<
            "Found '" << c << "'" << endl;
        }
    } else if (c == '(')
    {
        return readPair(in);
    } else if (c == '\'')
    {
        const Value *result = nullptr;
        GcGuard guard{gc_};
        guard.pushLocalStackRoot(&result);
        result = read(in);
        if (!result) return nullptr;
        result = makeCell(result, NIL);
        result = makeCell(QUOTE, result);
        return result;
    } else
    {
        std::string msg;
        msg.append("bad input. unexpected '");
        msg.append(1, c);
        msg.append("'");
        throw KatException(msg);
    }
    throw KatException("illegal read state");
}